

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinMakeArray
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Stack *this_00;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  uint offset;
  pointer pFVar3;
  pointer pVVar4;
  HeapEntity *pHVar5;
  _func_int **pp_Var6;
  bool bVar7;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *this_02;
  pointer __first;
  HeapThunk *this_03;
  _Rb_tree_node_base *p_Var8;
  HeapThunk *this_04;
  _Base_ptr p_Var9;
  mapped_type *ppHVar10;
  ostream *poVar11;
  RuntimeError *pRVar12;
  allocator_type *in_RCX;
  allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*> *extraout_RDX;
  size_t __n;
  size_type __n_00;
  size_type sVar13;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value v;
  Value VVar14;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  elements;
  HeapThunk *th;
  pointer local_1f0;
  HeapEntity *local_1e8;
  HeapThunk *local_1e0;
  size_type local_1d8;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_1d0;
  stringstream ss;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  pFVar3 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"makeArray",(allocator<char> *)&elements);
  th = (HeapThunk *)0x1100000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&th;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_1d0,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&ss,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_1d0);
  this_00 = &this->stack;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_1d0);
  std::__cxx11::string::~string((string *)&ss);
  pVVar4 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n_00 = (size_type)(pVVar4->v).d;
  if ((long)__n_00 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar11 = std::operator<<(local_1a8,"makeArray requires size >= 0, got ");
    std::ostream::_M_insert<long>((long)poVar11);
    pRVar12 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar12,this_00,loc,(string *)&th);
    __cxa_throw(pRVar12,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pHVar5 = pVVar4[1].v.h;
  elements.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elements.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elements.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(long *)&pHVar5[5].mark - (long)pHVar5[5]._vptr_HeapEntity != 0x10) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar11 = std::operator<<(local_1a8,"makeArray function must take 1 param, got: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    pRVar12 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar12,this_00,loc,(string *)&th);
    __cxa_throw(pRVar12,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (__n_00 != 0) {
    sVar13 = __n_00;
    this_02 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)std::
                 vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 ::_M_check_len(&elements,__n_00,"vector::_M_default_append");
    __first = std::
              _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::_M_allocate(this_02,sVar13);
    std::
    __uninitialized_default_n_a<jsonnet::internal::(anonymous_namespace)::HeapThunk**,unsigned_long,jsonnet::internal::(anonymous_namespace)::HeapThunk*>
              (__first,__n_00,extraout_RDX);
    std::
    _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::_M_deallocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)0x0,(pointer)0x0,__n);
    elements.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first + __n_00;
    elements.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __first + (long)this_02;
    elements.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __first;
  }
  this_01 = &(this->heap).entities;
  p_Var1 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
  local_1e8 = pHVar5 + 1;
  local_1f0 = elements.
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  for (sVar13 = 0; sVar13 != __n_00; sVar13 = sVar13 + 1) {
    this_03 = (HeapThunk *)operator_new(0x70);
    offset._0_1_ = pHVar5[4].mark;
    offset._1_1_ = pHVar5[4].type;
    offset._2_2_ = *(undefined2 *)&pHVar5[4].field_0xa;
    HeapThunk::HeapThunk
              (this_03,this->idArrayElement,(HeapObject *)pHVar5[4]._vptr_HeapEntity,offset,
               *(AST **)&pHVar5[6].mark);
    _ss = (pointer)this_03;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
    ::push_back(this_01,(value_type *)&ss);
    (this_03->super_HeapEntity).mark = (this->heap).lastMark;
    (this->heap).numEntities =
         (long)(this->heap).entities.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->heap).entities.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar7 = Heap::checkHeap(&this->heap);
    if (bVar7) {
      Heap::markFrom(&this->heap,(HeapEntity *)this_03);
      Stack::mark(this_00,&this->heap);
      VVar14._4_4_ = 0;
      VVar14.t = (this->scratch).t;
      VVar14.v.h = (this->scratch).v.h;
      Heap::markFrom(&this->heap,VVar14);
      for (p_Var8 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != p_Var1;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        if (*(HeapEntity **)(*(long *)(p_Var8 + 3) + 0x40) != (HeapEntity *)0x0) {
          Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var8 + 3) + 0x40));
        }
      }
      for (p_Var8 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != p_Var2;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var8 + 2));
      }
      Heap::sweep(&this->heap);
    }
    th = this_03;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back(&pFVar3[-1].thunks,&th);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::operator=(&this_03->upValues,
                (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)local_1e8);
    pp_Var6 = pHVar5[5]._vptr_HeapEntity;
    local_1e0 = this_03;
    local_1d8 = sVar13;
    this_04 = (HeapThunk *)operator_new(0x70);
    HeapThunk::HeapThunk(this_04,(Identifier *)*pp_Var6,(HeapObject *)0x0,0,(AST *)0x0);
    _ss = (pointer)this_04;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
    ::push_back(this_01,(value_type *)&ss);
    (this_04->super_HeapEntity).mark = (this->heap).lastMark;
    (this->heap).numEntities =
         (long)(this->heap).entities.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->heap).entities.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar7 = Heap::checkHeap(&this->heap);
    if (bVar7) {
      Heap::markFrom(&this->heap,(HeapEntity *)this_04);
      Stack::mark(this_00,&this->heap);
      v._4_4_ = 0;
      v.t = (this->scratch).t;
      v.v.h = (this->scratch).v.h;
      Heap::markFrom(&this->heap,v);
      for (p_Var9 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
      {
        if (*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40) != (HeapEntity *)0x0) {
          Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40));
        }
      }
      for (p_Var9 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != p_Var2; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
      {
        Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var9 + 2));
      }
      Heap::sweep(&this->heap);
    }
    sVar13 = local_1d8;
    _ss = 2;
    HeapThunk::fill(this_04,(Value *)&ss);
    ppHVar10 = std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               ::operator[](&this_03->upValues,(key_type *)pHVar5[5]._vptr_HeapEntity);
    *ppHVar10 = this_04;
    local_1f0[sVar13] = local_1e0;
  }
  VVar14 = makeArray(this,&elements);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar14._0_8_;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~_Vector_base(&elements.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 );
  return (AST *)0x0;
}

Assistant:

const AST *builtinMakeArray(const LocationRange &loc, const std::vector<Value> &args)
    {
        Frame &f = stack.top();
        validateBuiltinArgs(loc, "makeArray", args, {Value::NUMBER, Value::FUNCTION});
        long sz = long(args[0].v.d);
        if (sz < 0) {
            std::stringstream ss;
            ss << "makeArray requires size >= 0, got " << sz;
            throw makeError(loc, ss.str());
        }
        auto *func = static_cast<const HeapClosure *>(args[1].v.h);
        std::vector<HeapThunk *> elements;
        if (func->params.size() != 1) {
            std::stringstream ss;
            ss << "makeArray function must take 1 param, got: " << func->params.size();
            throw makeError(loc, ss.str());
        }
        elements.resize(sz);
        for (long i = 0; i < sz; ++i) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, func->self, func->offset, func->body);
            // The next line stops the new thunks from being GCed.
            f.thunks.push_back(th);
            th->upValues = func->upValues;

            auto *el = makeHeap<HeapThunk>(func->params[0].id, nullptr, 0, nullptr);
            el->fill(makeNumber(i));  // i guaranteed not to be inf/NaN
            th->upValues[func->params[0].id] = el;
            elements[i] = th;
        }
        scratch = makeArray(elements);
        return nullptr;
    }